

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram.c
# Opt level: O0

CURLcode Curl_auth_create_cram_md5_message(bufref *chlg,char *userp,char *passwdp,bufref *out)

{
  uint uVar1;
  size_t sVar2;
  HMAC_context *ctxt_00;
  size_t sVar3;
  uchar *data;
  char *__s;
  char *response;
  uchar digest [16];
  HMAC_context *ctxt;
  bufref *out_local;
  char *passwdp_local;
  char *userp_local;
  bufref *chlg_local;
  
  sVar2 = strlen(passwdp);
  uVar1 = curlx_uztoui(sVar2);
  ctxt_00 = Curl_HMAC_init(Curl_HMAC_MD5,(uchar *)passwdp,uVar1);
  if (ctxt_00 == (HMAC_context *)0x0) {
    chlg_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    sVar3 = Curl_bufref_len(chlg);
    if (sVar3 != 0) {
      data = Curl_bufref_ptr(chlg);
      sVar3 = Curl_bufref_len(chlg);
      uVar1 = curlx_uztoui(sVar3);
      Curl_HMAC_update(ctxt_00,data,uVar1);
    }
    Curl_HMAC_final(ctxt_00,(uchar *)&response);
    __s = curl_maprintf("%s %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x",userp,
                        (ulong)(byte)response,(ulong)response._1_1_,(ulong)response._2_1_,
                        (ulong)response._3_1_,(uint)response._4_1_,(uint)response._5_1_,
                        (uint)response._6_1_,(uint)response._7_1_,(uint)digest[0],(uint)digest[1],
                        (uint)digest[2],(uint)digest[3],(uint)digest[4],(uint)digest[5],
                        (uint)digest[6],(uint)digest[7]);
    if (__s == (char *)0x0) {
      chlg_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      sVar2 = strlen(__s);
      Curl_bufref_set(out,__s,sVar2,curl_free);
      chlg_local._4_4_ = CURLE_OK;
    }
  }
  return chlg_local._4_4_;
}

Assistant:

CURLcode Curl_auth_create_cram_md5_message(const struct bufref *chlg,
                                           const char *userp,
                                           const char *passwdp,
                                           struct bufref *out)
{
  struct HMAC_context *ctxt;
  unsigned char digest[MD5_DIGEST_LEN];
  char *response;

  /* Compute the digest using the password as the key */
  ctxt = Curl_HMAC_init(Curl_HMAC_MD5,
                        (const unsigned char *) passwdp,
                        curlx_uztoui(strlen(passwdp)));
  if(!ctxt)
    return CURLE_OUT_OF_MEMORY;

  /* Update the digest with the given challenge */
  if(Curl_bufref_len(chlg))
    Curl_HMAC_update(ctxt, Curl_bufref_ptr(chlg),
                     curlx_uztoui(Curl_bufref_len(chlg)));

  /* Finalise the digest */
  Curl_HMAC_final(ctxt, digest);

  /* Generate the response */
  response = aprintf(
    "%s %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x",
    userp, digest[0], digest[1], digest[2], digest[3], digest[4],
    digest[5], digest[6], digest[7], digest[8], digest[9], digest[10],
    digest[11], digest[12], digest[13], digest[14], digest[15]);
  if(!response)
    return CURLE_OUT_OF_MEMORY;

  Curl_bufref_set(out, response, strlen(response), curl_free);
  return CURLE_OK;
}